

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O1

string * fs_file_name_abi_cxx11_(string_view path)

{
  path *ppVar1;
  path *ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> local_71;
  path local_70;
  path local_48;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_70,&local_20,auto_format);
  if (local_70._M_pathname._M_string_length != 0) {
    ppVar1 = &local_70;
    if ((~local_70._M_cmpts & 3) == 0) {
LAB_0011438c:
      std::filesystem::__cxx11::path::path(&local_48,ppVar1);
      goto LAB_001143a5;
    }
    if (((local_70._32_8_ & 3) == 0) &&
       (local_70._M_pathname._M_dataplus._M_p[local_70._M_pathname._M_string_length - 1] != '/')) {
      if ((local_70._32_8_ & 3) == 0) {
        ppVar1 = (path *)std::filesystem::__cxx11::path::_List::end();
      }
      else {
        ppVar1 = (path *)0x0;
      }
      ppVar2 = (path *)&ppVar1[-2]._M_cmpts;
      if ((local_70._32_8_ & 3) != 0) {
        ppVar2 = ppVar1;
      }
      ppVar1 = &local_70;
      if ((local_70._32_8_ & 3) == 0) {
        ppVar1 = ppVar2;
      }
      if ((~*(uint *)&ppVar1->_M_cmpts & 3) == 0) {
        ppVar1 = &local_70;
        if ((local_70._32_8_ & 3) == 0) {
          ppVar1 = ppVar2;
        }
        goto LAB_0011438c;
      }
    }
  }
  std::filesystem::__cxx11::path::path(&local_48);
LAB_001143a5:
  std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
            (in_RDI,&local_48,&local_71);
  std::filesystem::__cxx11::path::~path(&local_48);
  std::filesystem::__cxx11::path::~path(&local_70);
  return in_RDI;
}

Assistant:

std::string fs_file_name(std::string_view path)
{
#ifdef HAVE_CXX_FILESYSTEM
  return std::filesystem::path(path).filename().generic_string();
#else

  const auto i = path.find_last_of(fs_is_windows() ? "/\\" : "/");

  return (i != std::string::npos)
    ? std::string(path.substr(i + 1))
    : std::string(path);
#endif
}